

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

int mspace_mallopt(int param_number,int value)

{
  size_t *psVar1;
  ulong uVar2;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  uVar2 = (ulong)value;
  if (param_number == -3) {
    psVar1 = &mparams.mmap_threshold;
  }
  else if (param_number == -1) {
    psVar1 = &mparams.trim_threshold;
  }
  else {
    if (param_number != -2) {
      return 0;
    }
    if (uVar2 < mparams.page_size || (uVar2 - 1 & uVar2) != 0) {
      return 0;
    }
    psVar1 = &mparams.granularity;
  }
  *psVar1 = uVar2;
  return 1;
}

Assistant:

int mspace_mallopt(int param_number, int value) {
  return change_mparam(param_number, value);
}